

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O2

int omac_acpkm_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  CMAC_ACPKM_CTX *ctx_00;
  uint inl;
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  
  puVar2 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  if (*(int *)(puVar2 + 3) == 0) {
    ERR_GOST_error(0x92,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                   ,0x151);
    return 0;
  }
  ctx_00 = (CMAC_ACPKM_CTX *)*puVar2;
  if (ctx_00->nlast_block == -1) {
    return 0;
  }
  if (count == 0) {
    return 1;
  }
  inl = EVP_CIPHER_CTX_get_block_size(ctx_00->cctx);
  uVar4 = (ulong)(int)inl;
  lVar3 = (long)ctx_00->nlast_block;
  if (0 < lVar3) {
    __n = uVar4 - lVar3;
    if (count <= uVar4 - lVar3) {
      __n = count;
    }
    memcpy(ctx_00->last_block + lVar3,data,__n);
    ctx_00->nlast_block = ctx_00->nlast_block + (int)__n;
    count = count - __n;
    if (count == 0) {
      return 1;
    }
    iVar1 = CMAC_ACPKM_Mesh(ctx_00);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,ctx_00->tbl,ctx_00->last_block,inl);
    if (iVar1 == 0) {
      return 0;
    }
    data = (void *)((long)data + __n);
    ctx_00->num = ctx_00->num + inl;
  }
  while( true ) {
    if (count < uVar4 || count - uVar4 == 0) {
      memcpy(ctx_00->last_block,data,count);
      ctx_00->nlast_block = (int)count;
      return 1;
    }
    iVar1 = CMAC_ACPKM_Mesh(ctx_00);
    if (iVar1 == 0) break;
    iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,ctx_00->tbl,(uchar *)data,inl);
    if (iVar1 == 0) {
      return 0;
    }
    data = (void *)((long)data + uVar4);
    ctx_00->num = ctx_00->num + inl;
    count = count - uVar4;
  }
  return 0;
}

Assistant:

static int omac_acpkm_imit_update(EVP_MD_CTX *ctx, const void *data,
                                  size_t count)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return CMAC_ACPKM_Update(c->cmac_ctx, data, count);
}